

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsPacket.cpp
# Opt level: O1

void __thiscall M2TSStreamInfo::M2TSStreamInfo(M2TSStreamInfo *this,PMTStreamInfo *pmtStreamInfo)

{
  double fps;
  VideoAspectRatio ar;
  AbstractStreamReader *pAVar1;
  bool interlaced;
  byte bVar2;
  uint uVar3;
  int iVar4;
  long *plVar5;
  AbstractStreamReader *pAVar6;
  uint8_t uVar7;
  
  (this->m_index).
  super__Vector_base<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>,_std::allocator<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_index).
  super__Vector_base<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>,_std::allocator<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_index).
  super__Vector_base<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>,_std::allocator<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->streamPID = pmtStreamInfo->m_pid;
  this->stream_coding_type = pmtStreamInfo->m_streamType;
  std::
  vector<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>,_std::allocator<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>_>_>
  ::operator=(&this->m_index,&pmtStreamInfo->m_index);
  this->isSecondary = pmtStreamInfo->isSecondary;
  this->language_code[0] = '\0';
  this->language_code[1] = '\0';
  this->language_code[2] = '\0';
  this->language_code[3] = '\0';
  *(undefined2 *)this->language_code = *(undefined2 *)pmtStreamInfo->m_lang;
  this->language_code[2] = pmtStreamInfo->m_lang[2];
  this->character_code = '\0';
  this->video_format = '\0';
  this->frame_rate_index = '\0';
  this->number_of_offset_sequences = 0;
  this->audio_presentation_type = '\0';
  this->sampling_frequency_index = '\0';
  this->aspect_ratio_index = '\x03';
  if (pmtStreamInfo->m_codecReader == (AbstractStreamReader *)0x0) {
    return;
  }
  plVar5 = (long *)__dynamic_cast(pmtStreamInfo->m_codecReader,&AbstractStreamReader::typeinfo,
                                  &MPEGStreamReader::typeinfo,0);
  if (plVar5 != (long *)0x0) {
    uVar3 = (**(code **)(*plVar5 + 0xa0))(plVar5);
    this->width = uVar3;
    uVar3 = (**(code **)(*plVar5 + 0xa8))(plVar5);
    this->height = uVar3;
    iVar4 = (**(code **)(*plVar5 + 0x48))(plVar5);
    this->HDR = iVar4;
    ar = *(VideoAspectRatio *)((long)plVar5 + 0x5c);
    fps = (double)plVar5[0x11];
    interlaced = (bool)(**(code **)(*plVar5 + 0xb0))(plVar5);
    blurayStreamParams(fps,interlaced,this->width,this->height,ar,&this->video_format,
                       &this->frame_rate_index,&this->aspect_ratio_index);
    if (ar == AR_221_100) {
      uVar3 = (this->height * 0xdd) / 100;
    }
    else {
      if (ar == AR_16_9) {
        uVar3 = (uint)((ulong)(this->height << 4) * 0x38e38e39 >> 0x20);
      }
      else {
        if (ar != AR_3_4) goto LAB_001e81b5;
        uVar3 = (uint)((ulong)(this->height << 2) * 0xaaaaaaab >> 0x20);
      }
      uVar3 = uVar3 >> 1;
    }
    this->width = uVar3;
  }
LAB_001e81b5:
  pAVar1 = pmtStreamInfo->m_codecReader;
  if ((pAVar1 == (AbstractStreamReader *)0x0) ||
     (pAVar6 = pAVar1,
     (pAVar1->super_BaseAbstractStreamReader)._vptr_BaseAbstractStreamReader !=
     (_func_int **)&PTR__H264StreamReader_00240778)) {
    pAVar6 = (AbstractStreamReader *)0x0;
  }
  if (pAVar6 != (AbstractStreamReader *)0x0) {
    this->number_of_offset_sequences = *(int *)((long)&pAVar6[3].m_curPos + 4);
  }
  if (pAVar1 == (AbstractStreamReader *)0x0) {
    plVar5 = (long *)0x0;
  }
  else {
    plVar5 = (long *)__dynamic_cast(pAVar1,&AbstractStreamReader::typeinfo,
                                    &SimplePacketizerReader::typeinfo,0);
  }
  if (plVar5 != (long *)0x0) {
    bVar2 = (**(code **)(*plVar5 + 0xb8))(plVar5);
    this->audio_presentation_type = bVar2;
    uVar7 = '\x03';
    if ((bVar2 == 2) || (uVar7 = '\x06', 3 < bVar2)) {
      this->audio_presentation_type = uVar7;
    }
    iVar4 = (**(code **)(*plVar5 + 0xa8))(plVar5);
    if (iVar4 == 48000) {
      iVar4 = (**(code **)(*plVar5 + 0xb0))(plVar5);
      bVar2 = 0xe;
      if (iVar4 != 96000) {
        iVar4 = (**(code **)(*plVar5 + 0xb0))(plVar5);
        bVar2 = 1;
        if (iVar4 == 0x2ee00) {
          bVar2 = 0xc;
        }
      }
    }
    else if (iVar4 == 96000) {
      iVar4 = (**(code **)(*plVar5 + 0xb0))(plVar5);
      bVar2 = (iVar4 == 0x2ee00) << 3 | 4;
    }
    else {
      bVar2 = 5;
      if (iVar4 != 0x2ee00) {
        return;
      }
    }
    this->sampling_frequency_index = bVar2;
  }
  return;
}

Assistant:

M2TSStreamInfo::M2TSStreamInfo(const PMTStreamInfo& pmtStreamInfo)
{
    streamPID = pmtStreamInfo.m_pid;
    stream_coding_type = pmtStreamInfo.m_streamType;
    m_index = pmtStreamInfo.m_index;
    isSecondary = pmtStreamInfo.isSecondary;
    memset(&language_code, 0, 4);
    memcpy(language_code, pmtStreamInfo.m_lang, 3);

    character_code = 0;
    video_format = 0;
    frame_rate_index = 0;
    number_of_offset_sequences = 0;
    audio_presentation_type = 0;
    sampling_frequency_index = 0;
    aspect_ratio_index = 3;  // 16:9; 2 = 4:3

    if (pmtStreamInfo.m_codecReader != nullptr)
    {
        const auto vStream = dynamic_cast<MPEGStreamReader*>(pmtStreamInfo.m_codecReader);
        if (vStream)
        {
            width = vStream->getStreamWidth();
            height = vStream->getStreamHeight();
            HDR = vStream->getStreamHDR();
            const VideoAspectRatio ar = vStream->getStreamAR();
            blurayStreamParams(vStream->getFPS(), vStream->getInterlaced(), width, height, ar, &video_format,
                               &frame_rate_index, &aspect_ratio_index);
            if (ar == VideoAspectRatio::AR_3_4)
                width = height * 4 / 3;
            else if (ar == VideoAspectRatio::AR_16_9)
                width = height * 16 / 9;
            else if (ar == VideoAspectRatio::AR_221_100)
                width = height * 221 / 100;
        }
        const auto h264Stream = dynamic_cast<H264StreamReader*>(pmtStreamInfo.m_codecReader);
        if (h264Stream)
            number_of_offset_sequences = h264Stream->getOffsetSeqCnt();

        const auto aStream = dynamic_cast<SimplePacketizerReader*>(pmtStreamInfo.m_codecReader);
        if (aStream)
        {
            audio_presentation_type = aStream->getChannels();
            if (audio_presentation_type == 2)
                audio_presentation_type = 3;
            else if (audio_presentation_type > 3)
                audio_presentation_type = 6;
            const int freq = aStream->getFreq();
            switch (freq)
            {
            case 48000:
                if (aStream->getAltFreq() == 96000)
                    sampling_frequency_index = 14;
                else if (aStream->getAltFreq() == 192000)
                    sampling_frequency_index = 12;
                else
                    sampling_frequency_index = 1;
                break;
            case 96000:
                if (aStream->getAltFreq() == 192000)
                    sampling_frequency_index = 12;
                else
                    sampling_frequency_index = 4;
                break;
            case 192000:
                sampling_frequency_index = 5;
                break;
            default:;
            }
        }
    }
}